

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O3

void bifinpevt(bifcxdef *ctx,int argc)

{
  uchar **ppuVar1;
  runsdef *prVar2;
  runcxdef *prVar3;
  uint16_t tmp_2;
  int iVar4;
  int unaff_EBP;
  int32_t tmp_1;
  undefined1 *__src;
  uint16_t tmp;
  uint uVar5;
  anon_union_8_4_1dda36f5_for_runsv unaff_R14;
  uint siz;
  os_event_info_t *info_00;
  runsdef val;
  char keyname [20];
  os_event_info_t info;
  runsdef local_158;
  undefined1 local_148 [288];
  
  if (argc == 0) {
    unaff_R14.runsvnum = 0;
    unaff_EBP = 0;
  }
  else if (0 < argc) {
    prVar2 = ctx->bifcxrun->runcxsp;
    ctx->bifcxrun->runcxsp = prVar2 + -1;
    prVar3 = ctx->bifcxrun;
    if (prVar2[-1].runstyp != '\x01') {
      prVar3->runcxerr->errcxptr->erraac = 0;
      runsign(ctx->bifcxrun,0x3eb);
    }
    if (argc != 1) {
      prVar3->runcxerr->errcxptr->erraac = 0;
      runsign(ctx->bifcxrun,0x401);
    }
    unaff_R14 = prVar3->runcxsp->runsv;
    unaff_EBP = 1;
  }
  outflushn(0);
  outreset();
  info_00 = (os_event_info_t *)(local_148 + 0x20);
  iVar4 = os_get_event(unaff_R14.runsvnum,unaff_EBP,info_00);
  if (iVar4 == 3) {
LAB_0012727a:
    unaff_R14.runsvnum = strlen(info_00->href);
    uVar5 = (int)unaff_R14.runsvnum + 10;
  }
  else {
    if (iVar4 == 1) {
      info_00 = (os_event_info_t *)local_148;
      get_ext_key_name(info_00->href,local_148._32_4_,local_148._36_4_);
      goto LAB_0012727a;
    }
    uVar5 = 7;
  }
  prVar3 = ctx->bifcxrun;
  local_158.runsv = (anon_union_8_4_1dda36f5_for_runsv)prVar3->runcxhp;
  siz = uVar5 & 0xffff;
  if ((uint)(*(int *)&prVar3->runcxhtop - (int)local_158.runsv.runsvnum) <= siz) {
    runhcmp(prVar3,siz,0,(runsdef *)0x0,(runsdef *)0x0,(runsdef *)0x0);
    local_158.runsv = (anon_union_8_4_1dda36f5_for_runsv)ctx->bifcxrun->runcxhp;
  }
  local_158.runstyp = '\a';
  *(short *)local_158.runsv.runsvstr = (short)uVar5;
  *(uchar *)(local_158.runsv.runsvnum + 2) = '\x01';
  *(int *)(local_158.runsv.runsvnum + 3) = iVar4;
  if (iVar4 == 3) {
    *(uchar *)(local_158.runsv.runsvnum + 7) = '\x03';
    *(objnum *)(local_158.runsv.runsvnum + 8) = unaff_R14.runsvobj + 2;
    __src = local_148 + 0x20;
  }
  else {
    if (iVar4 != 1) goto LAB_00127319;
    *(uchar *)(local_158.runsv.runsvnum + 7) = '\x03';
    *(objnum *)(local_158.runsv.runsvnum + 8) = unaff_R14.runsvobj + 2;
    __src = local_148;
  }
  memcpy((uchar *)(local_158.runsv.runsvnum + 10),__src,unaff_R14.runsvnum);
LAB_00127319:
  ppuVar1 = &ctx->bifcxrun->runcxhp;
  *ppuVar1 = *ppuVar1 + siz;
  runrepush(ctx->bifcxrun,&local_158);
  return;
}

Assistant:

void bifinpevt(bifcxdef *ctx, int argc)
{
    unsigned long timeout;
    int use_timeout;
    os_event_info_t info;
    int evt;
    uchar *p;
    ushort lstsiz;
    runsdef val;
    size_t paramlen;
    char keyname[20];
    
    /* check for a timeout value */
    if (argc == 0)
    {
        /* there's no timeout */
        use_timeout = FALSE;
        timeout = 0;
    }
    else if (argc >= 1)
    {
        /* get the timeout value */
        use_timeout = TRUE;
        timeout = (unsigned long)runpopnum(ctx->bifcxrun);
    }

    /* ensure we don't have too many arguments */
    if (argc > 1)
        runsig(ctx->bifcxrun, ERR_BIFARGC);

    /* flush any pending output */
    tioflushn(ctx->bifcxtio, 0);

    /* reset count of lines since keyboard input */
    tioreset(ctx->bifcxtio);

    /* ask the OS code for an event */
    evt = os_get_event(timeout, use_timeout, &info);

    /* 
     *   the list always minimally needs two bytes of length prefix plus a
     *   number with the event code (one byte for the type, four bytes for
     *   the value) 
     */
    lstsiz = 2 + (1 + 4);

    /* figure out how much space we'll need based on the event type */
    switch(evt)
    {
    case OS_EVT_KEY:
        /* 
         *   we need space for a string with one or two bytes (depending
         *   on whether or not we have an extended key code) - 1 byte for
         *   type code, 2 for length prefix, and 1 or 2 for the string's
         *   contents 
         */
        paramlen = (info.key[0] == 0 ? 2 : 1);

        /* map the extended key */
        get_ext_key_name(keyname, info.key[0], info.key[1]);

        /* determine the length we need for the string */
        paramlen = strlen(keyname);

        /* add it into the list */
        lstsiz += 1 + 2 + paramlen;
        break;

    case OS_EVT_HREF:
        /* 
         *   we need space for the href string - 1 byte for type code, 2
         *   for length prefix, plus the string's contents 
         */
        paramlen = strlen(info.href);
        lstsiz += 1 + 2 + (ushort)paramlen;
        break;

    default:
        /* other event types have no extra data */
        break;
    }

    /* allocate space for the list */
    runhres(ctx->bifcxrun, lstsiz, 0);

    /* set up the stack value */
    val.runstyp = DAT_LIST;
    p = val.runsv.runsvstr = ctx->bifcxrun->runcxhp;

    /* set up the list length prefix */
    oswp2(p, lstsiz);
    p += 2;

    /* set up the event type element */
    *p++ = DAT_NUMBER;
    oswp4s(p, evt);
    p += 4;

    /* add the event parameters, if any */
    switch(evt)
    {
    case OS_EVT_KEY:
        /* set up the string for the key */
        *p++ = DAT_SSTRING;
        oswp2(p, paramlen + 2);
        p += 2;

        /* add the characters to the string */
        memcpy(p, keyname, paramlen);
        p += paramlen;
        break;

    case OS_EVT_HREF:
        /* add the string for the href */
        *p++ = DAT_SSTRING;
        oswp2(p, paramlen + 2);
        memcpy(p + 2, info.href, paramlen);
        break;
    }

    /* consume the heap space */
    ctx->bifcxrun->runcxhp += lstsiz;

    /* push the result */
    runrepush(ctx->bifcxrun, &val);
}